

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::Pxr24Compressor::compress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  PixelType PVar1;
  bool bVar2;
  unsigned_short uVar3;
  int iVar4;
  int *piVar5;
  BaseExc *this_00;
  undefined4 *in_RCX;
  int in_EDX;
  unsigned_short *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  double dVar6;
  uLongf outSize;
  uint diff_2;
  uint pixel24;
  size_t k_1;
  char *pPtr_1;
  float pixel_2;
  int j_2;
  uint diff_1;
  half pixel_1;
  int j_1;
  uint diff;
  size_t k;
  char *pPtr;
  uint pixel;
  int j;
  uint previousPixel;
  uchar *ptr [4];
  int n;
  Channel *c;
  ConstIterator i;
  int y;
  uchar *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  ConstIterator *in_stack_fffffffffffffef0;
  long local_f0;
  int local_e8;
  uint local_e4;
  ulong local_e0;
  float *local_d8;
  float local_d0;
  int local_cc;
  int local_c8;
  half local_c2;
  int local_c0;
  int local_bc;
  ulong local_b8;
  uint *local_b0;
  uint local_a4;
  int local_a0;
  uint local_9c;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  int local_6c;
  Channel *local_68;
  const_iterator local_60;
  const_iterator local_58;
  int local_4c;
  undefined1 *local_48;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  unsigned_short *local_18;
  int local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = 0;
  }
  else {
    local_34 = *in_RCX;
    local_30 = in_R8;
    local_18 = in_RSI;
    piVar5 = std::min<int>(in_RCX + 2,(int *)(in_RDI + 0x34));
    local_38 = *piVar5;
    local_3c = in_RCX[1];
    piVar5 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 0x38));
    local_40 = *piVar5;
    local_48 = *(undefined1 **)(in_RDI + 0x18);
    for (local_4c = local_3c; local_4c <= local_40; local_4c = local_4c + 1) {
      local_58._M_node =
           (_Base_ptr)
           ChannelList::begin((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      while( true ) {
        local_60._M_node =
             (_Base_ptr)
             ChannelList::end((ChannelList *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        bVar2 = Imf_2_5::operator!=(in_stack_fffffffffffffef0,
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (!bVar2) break;
        local_68 = ChannelList::ConstIterator::channel((ConstIterator *)0x7ef752);
        iVar4 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                                (int)in_stack_fffffffffffffef0);
        if (iVar4 == 0) {
          local_6c = numSamples((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                                (int)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          local_9c = 0;
          PVar1 = local_68->type;
          if (PVar1 == UINT) {
            local_98 = local_48;
            local_90 = local_48 + local_6c;
            local_88 = local_90 + local_6c;
            local_48 = local_88 + local_6c + local_6c;
            local_80 = local_88 + local_6c;
            for (local_a0 = 0; local_a0 < local_6c; local_a0 = local_a0 + 1) {
              local_b0 = &local_a4;
              for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
                uVar3 = *local_18;
                local_18 = (unsigned_short *)((long)local_18 + 1);
                *(char *)local_b0 = (char)uVar3;
                local_b0 = (uint *)((long)local_b0 + 1);
              }
              local_bc = local_a4 - local_9c;
              local_9c = local_a4;
              *local_98 = (char)((uint)local_bc >> 0x18);
              *local_90 = (char)((uint)local_bc >> 0x10);
              *local_88 = (char)((uint)local_bc >> 8);
              *local_80 = (char)local_bc;
              local_98 = local_98 + 1;
              local_90 = local_90 + 1;
              local_88 = local_88 + 1;
              local_80 = local_80 + 1;
            }
          }
          else if (PVar1 == HALF) {
            local_98 = local_48;
            local_90 = local_48 + local_6c;
            local_48 = local_90 + local_6c;
            for (local_c0 = 0; local_c0 < local_6c; local_c0 = local_c0 + 1) {
              local_c2._h = *local_18;
              local_18 = local_18 + 1;
              uVar3 = ::half::bits(&local_c2);
              local_c8 = uVar3 - local_9c;
              uVar3 = ::half::bits(&local_c2);
              local_9c = (uint)uVar3;
              *local_98 = (char)((uint)local_c8 >> 8);
              *local_90 = (char)local_c8;
              local_98 = local_98 + 1;
              local_90 = local_90 + 1;
            }
          }
          else if (PVar1 == FLOAT) {
            local_98 = local_48;
            local_90 = local_48 + local_6c;
            local_48 = local_90 + local_6c + local_6c;
            local_88 = local_90 + local_6c;
            for (local_cc = 0; local_cc < local_6c; local_cc = local_cc + 1) {
              local_d8 = &local_d0;
              for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
                uVar3 = *local_18;
                local_18 = (unsigned_short *)((long)local_18 + 1);
                *(char *)local_d8 = (char)uVar3;
                local_d8 = (float *)((long)local_d8 + 1);
              }
              local_e4 = anon_unknown_9::floatToFloat24(local_d0);
              local_e8 = local_e4 - local_9c;
              *local_98 = (char)((uint)local_e8 >> 0x10);
              *local_90 = (char)((uint)local_e8 >> 8);
              *local_88 = (char)local_e8;
              local_9c = local_e4;
              local_98 = local_98 + 1;
              local_90 = local_90 + 1;
              local_88 = local_88 + 1;
            }
          }
        }
        ChannelList::ConstIterator::operator++(in_stack_fffffffffffffef0);
      }
    }
    dVar6 = ceil((double)((long)local_48 - *(long *)(in_RDI + 0x18)) * 1.01);
    local_f0 = (long)((int)dVar6 + 100);
    iVar4 = ::compress(*(undefined8 *)(in_RDI + 0x20),&local_f0,*(undefined8 *)(in_RDI + 0x18),
                       (long)local_48 - *(long *)(in_RDI + 0x18));
    if (iVar4 != 0) {
      this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
      __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    *local_30 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = (int)local_f0;
  }
  return local_4;
}

Assistant:

int
Pxr24Compressor::compress (const char *inPtr,
			   int inSize,
			   Box2i range,
			   const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    unsigned char *tmpBufferEnd = _tmpBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    unsigned char *ptr[4];
	    unsigned int previousPixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		for (int j = 0; j < n; ++j)
		{
		    unsigned int pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int diff = pixel - previousPixel;
		    previousPixel = pixel;

		    *(ptr[0]++) = diff >> 24;
		    *(ptr[1]++) = diff >> 16;
		    *(ptr[2]++) = diff >> 8;
		    *(ptr[3]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

		for (int j = 0; j < n; ++j)
		{
		    half pixel;

		    pixel = *(const half *) inPtr;
		    inPtr += sizeof (half);

		    unsigned int diff = pixel.bits() - previousPixel;
		    previousPixel = pixel.bits();

		    *(ptr[0]++) = diff >> 8;
		    *(ptr[1]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

		for (int j = 0; j < n; ++j)
		{
		    float pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int pixel24 = floatToFloat24 (pixel);
		    unsigned int diff = pixel24 - previousPixel;
		    previousPixel = pixel24;

		    *(ptr[0]++) = diff >> 16;
		    *(ptr[1]++) = diff >> 8;
		    *(ptr[2]++) = diff;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    uLongf outSize = int (ceil ((tmpBufferEnd - _tmpBuffer) * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *) _outBuffer,
			    &outSize,
			    (const Bytef *) _tmpBuffer,
			    tmpBufferEnd - _tmpBuffer))
    {
	throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    outPtr = _outBuffer;
    return outSize;
}